

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O1

QMetaMethodBuilderPrivate * __thiscall QMetaMethodBuilder::d_func(QMetaMethodBuilder *this)

{
  uint uVar1;
  pointer pQVar2;
  QMetaObjectBuilder *pQVar3;
  ulong uVar4;
  ulong uVar5;
  
  pQVar3 = this->_mobj;
  if (pQVar3 != (QMetaObjectBuilder *)0x0) {
    uVar4 = (ulong)this->_index;
    if (-1 < (long)uVar4) {
      pQVar2 = (pQVar3->d->methods).
               super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(pQVar3->d->methods).
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pQVar2 >> 3) *
              0x4ec4ec4ec4ec4ec5;
      if (this->_index < (int)uVar5) {
        if (uVar4 <= uVar5 && uVar5 - uVar4 != 0) goto LAB_0028f70b;
        d_func();
      }
    }
    if ((pQVar3 != (QMetaObjectBuilder *)0x0) && (uVar1 = this->_index, (int)uVar1 < 0)) {
      pQVar2 = (pQVar3->d->constructors).
               super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(pQVar3->d->constructors).
                     super__Vector_base<QMetaMethodBuilderPrivate,_std::allocator<QMetaMethodBuilderPrivate>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pQVar2 >> 3) *
              0x4ec4ec4ec4ec4ec5;
      if ((int)-uVar1 <= (int)uVar5) {
        uVar4 = (ulong)~uVar1;
        if (uVar5 < uVar4 || uVar5 - uVar4 == 0) {
          d_func();
        }
LAB_0028f70b:
        return pQVar2 + uVar4;
      }
    }
  }
  return (QMetaMethodBuilderPrivate *)0x0;
}

Assistant:

QMetaMethodBuilderPrivate *QMetaMethodBuilder::d_func() const
{
    // Positive indices indicate methods, negative indices indicate constructors.
    if (_mobj && _index >= 0 && _index < int(_mobj->d->methods.size()))
        return &(_mobj->d->methods[_index]);
    else if (_mobj && -_index >= 1 && -_index <= int(_mobj->d->constructors.size()))
        return &(_mobj->d->constructors[(-_index) - 1]);
    else
        return nullptr;
}